

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.h
# Opt level: O2

const_reference __thiscall cmList::get_item_abi_cxx11_(cmList *this,index_type pos)

{
  size_type __n;
  const_reference pvVar1;
  
  __n = ComputeIndex(this,pos,true);
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&this->Values,__n);
  return pvVar1;
}

Assistant:

const_reference get_item(index_type pos) const
  {
    return this->Values.at(this->ComputeIndex(pos));
  }